

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roster.cpp
# Opt level: O0

void __thiscall Roster::printInvalidEmails(Roster *this)

{
  long lVar1;
  ostream *poVar2;
  size_t foundWhiteSpace;
  size_t foundPeriod;
  size_t foundAtSymbol;
  string currentEmail;
  int local_14;
  int i;
  Roster *this_local;
  
  for (local_14 = 0; local_14 < 5; local_14 = local_14 + 1) {
    Student::getEmail_abi_cxx11_((Student *)&foundAtSymbol);
    lVar1 = std::__cxx11::string::find((char *)&foundAtSymbol,0x1070e1);
    if (lVar1 == -1) {
      poVar2 = std::operator<<((ostream *)&std::cout,(string *)&foundAtSymbol);
      poVar2 = std::operator<<(poVar2," ---> Missing \'@\' character in email");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    lVar1 = std::__cxx11::string::find((char *)&foundAtSymbol,0x1070c8);
    if (lVar1 == -1) {
      poVar2 = std::operator<<((ostream *)&std::cout,(string *)&foundAtSymbol);
      poVar2 = std::operator<<(poVar2," ---> Missing \'.\' character in email");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    lVar1 = std::__cxx11::string::find((char *)&foundAtSymbol,0x10703b);
    if (lVar1 != -1) {
      poVar2 = std::operator<<((ostream *)&std::cout,(string *)&foundAtSymbol);
      poVar2 = std::operator<<(poVar2,"---> White space not allowed in email");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    std::__cxx11::string::~string((string *)&foundAtSymbol);
  }
  return;
}

Assistant:

void Roster::printInvalidEmails() {
    for (int i = 0; i < ARRAY_LENGTH; i++) {
        string currentEmail = classRosterArray[i]->getEmail();

        size_t foundAtSymbol = currentEmail.find("@");
        if (foundAtSymbol == string::npos) {
            cout << currentEmail << " ---> Missing '@' character in email" << endl;
        }

        size_t foundPeriod = currentEmail.find(".");
        if (foundPeriod == string::npos) {
            cout << currentEmail << " ---> Missing '.' character in email" << endl;
        }

        size_t foundWhiteSpace = currentEmail.find(" ");
        if (foundWhiteSpace != string::npos) {
            cout << currentEmail << "---> White space not allowed in email" << endl;
        }
    }
}